

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

ENetProtocolCommand
enet_protocol_remove_sent_reliable_command
          (ENetPeer *peer,enet_uint16 reliableSequenceNumber,enet_uint8 channelID)

{
  ushort uVar1;
  bool bVar2;
  long lVar3;
  byte in_DL;
  ushort in_SI;
  long in_RDI;
  enet_uint16 reliableWindow;
  ENetChannel *channel;
  int wasSent;
  ENetProtocolCommand commandNumber;
  ENetListIterator currentCommand;
  ENetOutgoingCommand *outgoingCommand;
  ENetListIterator local_28;
  ENetListIterator local_20;
  ENetProtocolCommand local_4;
  
  local_20 = (ENetListIterator)0x0;
  bVar2 = true;
  for (local_28 = *(ENetListIterator *)(in_RDI + 0xf0);
      local_28 != (ENetListIterator)(in_RDI + 0xf0); local_28 = local_28->next) {
    local_20 = local_28;
    if ((*(ushort *)&local_28[1].next == in_SI) &&
       (*(byte *)((long)&local_28[2].previous + 1) == in_DL)) break;
  }
  if (local_28 == (ENetListIterator)(in_RDI + 0xf0)) {
    for (local_28 = *(ENetListIterator *)(in_RDI + 0x110);
        local_28 != (ENetListIterator)(in_RDI + 0x110); local_28 = local_28->next) {
      local_20 = local_28;
      if (*(short *)((long)&local_28[2].next + 6) == 0) {
        return ENET_PROTOCOL_COMMAND_NONE;
      }
      if ((*(ushort *)&local_28[1].next == in_SI) &&
         (*(byte *)((long)&local_28[2].previous + 1) == in_DL)) break;
    }
    if (local_28 == (ENetListIterator)(in_RDI + 0x110)) {
      return ENET_PROTOCOL_COMMAND_NONE;
    }
    bVar2 = false;
  }
  if (local_20 == (ENetListIterator)0x0) {
    local_4 = ENET_PROTOCOL_COMMAND_NONE;
  }
  else {
    if ((ulong)in_DL < *(ulong *)(in_RDI + 0x48)) {
      lVar3 = *(long *)(in_RDI + 0x40) + (ulong)in_DL * 0x50;
      uVar1 = in_SI / 0x1000;
      if ((*(short *)(lVar3 + 6 + (ulong)uVar1 * 2) != 0) &&
         (*(short *)(lVar3 + 6 + (ulong)uVar1 * 2) = *(short *)(lVar3 + 6 + (ulong)uVar1 * 2) + -1,
         *(short *)(lVar3 + 6 + (ulong)uVar1 * 2) == 0)) {
        *(ushort *)(lVar3 + 4) = *(ushort *)(lVar3 + 4) & ((ushort)(1 << (sbyte)uVar1) ^ 0xffff);
      }
    }
    local_4 = *(byte *)&local_20[2].previous & ENET_PROTOCOL_COMMAND_MASK;
    enet_list_remove(local_20);
    if (local_20[6].next != (_ENetListNode *)0x0) {
      if (bVar2) {
        *(uint *)(in_RDI + 0xd8) =
             *(int *)(in_RDI + 0xd8) - (uint)*(ushort *)((long)&local_20[2].next + 4);
      }
      (local_20[6].next)->next = (_ENetListNode *)((long)&(local_20[6].next)->next[-1].previous + 7)
      ;
      if ((local_20[6].next)->next == (_ENetListNode *)0x0) {
        *(uint *)&(local_20[6].next)->previous = *(uint *)&(local_20[6].next)->previous | 0x100;
        enet_packet_destroy((ENetPacket *)0x10d1fb);
      }
    }
    enet_free((void *)0x10d207);
    if (*(long *)(in_RDI + 0xf0) != in_RDI + 0xf0) {
      *(int *)(in_RDI + 0x70) =
           *(int *)(*(long *)(in_RDI + 0xf0) + 0x14) + *(int *)(*(long *)(in_RDI + 0xf0) + 0x18);
    }
  }
  return local_4;
}

Assistant:

static ENetProtocolCommand
enet_protocol_remove_sent_reliable_command (ENetPeer * peer, enet_uint16 reliableSequenceNumber, enet_uint8 channelID)
{
    ENetOutgoingCommand * outgoingCommand = NULL;
    ENetListIterator currentCommand;
    ENetProtocolCommand commandNumber;
    int wasSent = 1;

    for (currentCommand = enet_list_begin (& peer -> sentReliableCommands);
         currentCommand != enet_list_end (& peer -> sentReliableCommands);
         currentCommand = enet_list_next (currentCommand))
    {
       outgoingCommand = (ENetOutgoingCommand *) currentCommand;
        
       if (outgoingCommand -> reliableSequenceNumber == reliableSequenceNumber &&
           outgoingCommand -> command.header.channelID == channelID)
         break;
    }

    if (currentCommand == enet_list_end (& peer -> sentReliableCommands))
    {
       for (currentCommand = enet_list_begin (& peer -> outgoingReliableCommands);
            currentCommand != enet_list_end (& peer -> outgoingReliableCommands);
            currentCommand = enet_list_next (currentCommand))
       {
          outgoingCommand = (ENetOutgoingCommand *) currentCommand;

          if (outgoingCommand -> sendAttempts < 1) return ENET_PROTOCOL_COMMAND_NONE;

          if (outgoingCommand -> reliableSequenceNumber == reliableSequenceNumber &&
              outgoingCommand -> command.header.channelID == channelID)
            break;
       }

       if (currentCommand == enet_list_end (& peer -> outgoingReliableCommands))
         return ENET_PROTOCOL_COMMAND_NONE;

       wasSent = 0;
    }

    if (outgoingCommand == NULL)
      return ENET_PROTOCOL_COMMAND_NONE;

    if (channelID < peer -> channelCount)
    {
       ENetChannel * channel = & peer -> channels [channelID];
       enet_uint16 reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
       if (channel -> reliableWindows [reliableWindow] > 0)
       {
          -- channel -> reliableWindows [reliableWindow];
          if (! channel -> reliableWindows [reliableWindow])
            channel -> usedReliableWindows &= ~ (1 << reliableWindow);
       }
    }

    commandNumber = (ENetProtocolCommand) (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK);
    
    enet_list_remove (& outgoingCommand -> outgoingCommandList);

    if (outgoingCommand -> packet != NULL)
    {
       if (wasSent)
         peer -> reliableDataInTransit -= outgoingCommand -> fragmentLength;

       -- outgoingCommand -> packet -> referenceCount;

       if (outgoingCommand -> packet -> referenceCount == 0)
       {
          outgoingCommand -> packet -> flags |= ENET_PACKET_FLAG_SENT;

          enet_packet_destroy (outgoingCommand -> packet);
       }
    }

    enet_free (outgoingCommand);

    if (enet_list_empty (& peer -> sentReliableCommands))
      return commandNumber;
    
    outgoingCommand = (ENetOutgoingCommand *) enet_list_front (& peer -> sentReliableCommands);
    
    peer -> nextTimeout = outgoingCommand -> sentTime + outgoingCommand -> roundTripTimeout;

    return commandNumber;
}